

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall kratos::Generator::remove_var(Generator *this,string *var_name)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this_00;
  int iVar1;
  iterator iVar2;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UserException *pUVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_78;
  string local_58;
  undefined1 local_30 [8];
  mapped_type var;
  
  this_00 = &this->vars_;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&this_00->_M_t,var_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (var_name->_M_dataplus)._M_p;
    local_58._M_string_length = var_name->_M_string_length;
    local_58.field_2._M_allocated_capacity = (size_type)(this->name)._M_dataplus._M_p;
    local_58.field_2._8_8_ = (this->name)._M_string_length;
    bVar5 = fmt::v7::to_string_view<char,_0>("Cannot find {0} from {1}");
    format_str.data_ = (char *)bVar5.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_58;
    fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar5.data_,format_str,args);
    UserException::UserException(pUVar4,&local_78);
    __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var3 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
            ::at(this_00,var_name)->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_30,p_Var3);
  iVar1 = (*((IRNode *)local_30)->_vptr_IRNode[0x10])();
  if (*(long *)(CONCAT44(extraout_var,iVar1) + 0x18) == 0) {
    iVar1 = (*((IRNode *)local_30)->_vptr_IRNode[0xe])();
    if (*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x18) == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
      ::erase(&this_00->_M_t,var_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var);
      return;
    }
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (((string *)((long)local_30 + 0x78))->_M_dataplus)._M_p;
    local_78._M_string_length = ((string *)((long)local_30 + 0x78))->_M_string_length;
    bVar5 = fmt::v7::to_string_view<char,_0>("{0} still has sink connection(s)");
    format_str_01.data_ = (char *)bVar5.size_;
    format_str_01.size_ = 0xd;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_78;
    fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar5.data_,format_str_01,args_01);
    UserException::UserException(pUVar4,&local_58);
    __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (((string *)((long)local_30 + 0x78))->_M_dataplus)._M_p;
  local_78._M_string_length = ((string *)((long)local_30 + 0x78))->_M_string_length;
  bVar5 = fmt::v7::to_string_view<char,_0>("{0} still has source connection(s)");
  format_str_00.data_ = (char *)bVar5.size_;
  format_str_00.size_ = 0xd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar5.data_,format_str_00,args_00);
  UserException::UserException(pUVar4,&local_58);
  __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::remove_var(const std::string &var_name) {
    if (vars_.find(var_name) == vars_.end()) {
        throw UserException(::format("Cannot find {0} from {1}", var_name, name));
    }
    auto var = vars_.at(var_name);
    if (!var->sources().empty()) {
        throw UserException(::format("{0} still has source connection(s)", var->name));
    }
    if (!var->sinks().empty()) {
        throw UserException(::format("{0} still has sink connection(s)", var->name));
    }

    vars_.erase(var_name);
}